

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationBar::hideEvent(NavigationBar *this,QHideEvent *e)

{
  bool bVar1;
  NavigationBarPrivate *pNVar2;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QHideEvent *e_local;
  NavigationBar *this_local;
  
  __fd = (int)e;
  bVar1 = QWidget::isVisible(&this->super_QWidget);
  __addr = extraout_RDX;
  if (!bVar1) {
    pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    QList<int>::clear(&(pNVar2->backStack).super_QList<int>);
    pNVar2 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    QList<int>::clear(&(pNVar2->forwardStack).super_QList<int>);
    QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
    ::operator->(&this->d);
    QWidget::hide();
    QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
    ::operator->(&this->d);
    QWidget::hide();
    __addr = extraout_RDX_00;
  }
  QEvent::accept((QEvent *)e,__fd,__addr,in_RCX);
  return;
}

Assistant:

void
NavigationBar::hideEvent( QHideEvent * e )
{
	if( !isVisible() )
	{
		d->backStack.clear();
		d->forwardStack.clear();

		d->left->hide();
		d->right->hide();
	}

	e->accept();
}